

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
EnrichableAnalyzerSubprocess::EmitBubble
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnrichableAnalyzerSubprocess *this,U64 packetId,U64 frameIndex,
          Frame *frame,string *channelName)

{
  uint bufferLength;
  ostream *poVar1;
  char *buffer;
  size_t sVar2;
  allocator local_319;
  string local_318 [32];
  char local_2f8 [8];
  char bubbleText [256];
  string value;
  stringstream local_1c8 [8];
  stringstream outputStream;
  ostream local_1b8 [376];
  undefined4 local_40;
  byte local_39;
  string *local_38;
  string *channelName_local;
  Frame *frame_local;
  U64 frameIndex_local;
  U64 packetId_local;
  EnrichableAnalyzerSubprocess *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *bubbles;
  
  local_39 = 0;
  local_38 = channelName;
  channelName_local = (string *)frame;
  frame_local = (Frame *)frameIndex;
  frameIndex_local = packetId;
  packetId_local = (U64)this;
  this_local = (EnrichableAnalyzerSubprocess *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  if (((this->enabled & 1U) == 0) || ((this->featureBubble & 1U) == 0)) {
    local_39 = 1;
    local_40 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(local_1b8,"bubble");
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,frameIndex_local);
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,(ulonglong)frame_local);
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,*(longlong *)channelName_local);
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,*(longlong *)(channelName_local + 8));
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,(ulong)(byte)channelName_local[0x20]);
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,(ulong)(byte)channelName_local[0x21]);
    std::operator<<(local_1b8,'\t');
    std::operator<<(local_1b8,(string *)channelName);
    std::operator<<(local_1b8,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::ostream::operator<<(poVar1,*(ulonglong *)(channelName_local + 0x10));
    std::operator<<(local_1b8,'\n');
    std::__cxx11::stringstream::str();
    LockSubprocess(this);
    buffer = (char *)std::__cxx11::string::c_str();
    bufferLength = std::__cxx11::string::length();
    SendOutputLine(this,buffer,bufferLength);
    while( true ) {
      GetInputLine(this,local_2f8,0x100);
      sVar2 = strlen(local_2f8);
      if (sVar2 == 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,local_2f8,&local_319);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_318);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
    UnlockSubprocess(this);
    local_39 = 1;
    local_40 = 1;
    std::__cxx11::string::~string((string *)(bubbleText + 0xf8));
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  if ((local_39 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> EnrichableAnalyzerSubprocess::EmitBubble(U64 packetId, U64 frameIndex, Frame& frame, std::string channelName) {
	std::vector<std::string> bubbles;

	if(! (enabled && featureBubble)) {
		return bubbles;
	}

	std::stringstream outputStream;
	outputStream << BUBBLE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << packetId;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frameIndex;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mStartingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mEndingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mType;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mFlags;
	outputStream << UNIT_SEPARATOR;
	outputStream << channelName;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mData1;
	outputStream << LINE_SEPARATOR;
	std::string value = outputStream.str();

	LockSubprocess();
	SendOutputLine(value.c_str(), value.length());
	char bubbleText[256];
	while(true) {
		GetInputLine(
			bubbleText,
			256
		);
		if(strlen(bubbleText) > 0) {
			bubbles.push_back(bubbleText);
		} else {
			break;
		}
	}
	UnlockSubprocess();

	return bubbles;
}